

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O2

double __thiscall Alg::max_cover_topk(Alg *this,int targetSize)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  pointer puVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  pointer pvVar10;
  size_type __n;
  pointer pvVar11;
  uint uVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *nodes;
  ulong uVar13;
  Alg *pAVar14;
  long lVar15;
  uint *puVar16;
  long lVar17;
  ostream *poVar18;
  pointer *ppuVar19;
  long lVar20;
  size_type *psVar21;
  ulong uVar22;
  iterator __begin2;
  iterator __end2;
  ulong uVar23;
  bool bVar24;
  double dVar25;
  undefined1 auVar26 [16];
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  reference rVar32;
  value_type seed;
  allocator_type local_121;
  long local_120;
  size_type *local_118;
  double dStack_110;
  Alg *local_100;
  Nodelist sortedNode;
  RRsets degMap;
  FRset coverage;
  vector<bool,_std::allocator<bool>_> edgeMark;
  Nodelist degreePosition;
  Nodelist nodePosition;
  
  edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&coverage,(ulong)this->__numV,(value_type_conflict2 *)&edgeMark,
             (allocator_type *)&degMap);
  uVar13 = (ulong)this->__numV;
  ppuVar19 = (pointer *)
             ((long)&(this->__hyperG)._FRsets.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13 - 1].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data + 8);
  uVar23 = 0;
  while (bVar24 = uVar13 != 0, uVar13 = uVar13 - 1, bVar24) {
    uVar22 = (long)*ppuVar19 - (long)((_Vector_impl_data *)(ppuVar19 + -1))->_M_start >> 3;
    coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar13] = uVar22;
    if (uVar23 < uVar22) {
      uVar23 = uVar22;
    }
    ppuVar19 = ppuVar19 + -3;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&degMap,uVar23 + 1,(allocator_type *)&edgeMark);
  pAVar14 = this;
  while( true ) {
    uVar12 = pAVar14->__numV - 1;
    edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         CONCAT44(edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar12);
    if (pAVar14->__numV == 0) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (degMap.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12],(value_type_conflict *)&edgeMark);
    pAVar14 = (Alg *)&edgeMark;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&sortedNode,(ulong)this->__numV,(allocator_type *)&edgeMark);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&nodePosition,(ulong)this->__numV,(allocator_type *)&edgeMark);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&degreePosition,uVar23 + 2,(allocator_type *)&edgeMark);
  lVar20 = 0;
  uVar12 = 0;
  for (; degMap.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         degMap.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      degMap.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           degMap.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    puVar16 = ((degMap.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar6 = ((degMap.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    degreePosition.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar20 + 1] =
         (int)((ulong)((long)puVar6 - (long)puVar16) >> 2) +
         degreePosition.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[lVar20];
    lVar20 = lVar20 + 1;
    for (; puVar16 != puVar6; puVar16 = puVar16 + 1) {
      nodePosition.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[*puVar16] = uVar12;
      uVar13 = (ulong)uVar12;
      uVar12 = uVar12 + 1;
      sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar13] = *puVar16;
    }
  }
  seed = seed & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&edgeMark,this->__numRRsets,(bool *)&seed,&local_121);
  lVar20 = 0;
  do {
    if (uVar23 == 0xffffffffffffffff) {
LAB_00104bdc:
      auVar29._8_4_ = (int)((ulong)lVar20 >> 0x20);
      auVar29._0_8_ = lVar20;
      auVar29._12_4_ = 0x45300000;
      dVar25 = (auVar29._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0);
      this->__boundMin = dVar25;
      puVar7 = (this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar7) {
        (this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar7;
      }
      lVar15 = (long)targetSize;
      local_120 = 0;
      local_100 = this;
      while (pAVar14 = local_100, bVar24 = targetSize != 0, targetSize = targetSize + -1, bVar24) {
        seed = sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
        sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
        uVar13 = ((long)sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) - lVar15;
        uVar8 = coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start
                [sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13]];
        uVar9 = coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[seed];
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->__vecSeed,&seed);
        local_120 = local_120 + uVar9;
        lVar20 = (uVar8 + lVar20) - uVar9;
        uVar23 = (ulong)seed;
        coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar23] = 0;
        pvVar10 = (pAVar14->__hyperG)._FRsets.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_118 = *(pointer *)
                     ((long)&pvVar10[uVar23].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data + 8);
        for (psVar21 = pvVar10[uVar23].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start; psVar21 != local_118; psVar21 = psVar21 + 1
            ) {
          __n = *psVar21;
          rVar32 = std::vector<bool,_std::allocator<bool>_>::operator[](&edgeMark,__n);
          if ((*rVar32._M_p & rVar32._M_mask) == 0) {
            rVar32 = std::vector<bool,_std::allocator<bool>_>::operator[](&edgeMark,__n);
            *rVar32._M_p = *rVar32._M_p | rVar32._M_mask;
            pvVar11 = (local_100->__hyperG)._RRsets.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar6 = *(pointer *)
                      ((long)&pvVar11[__n].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data + 8);
            for (puVar16 = pvVar11[__n].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start; puVar16 != puVar6;
                puVar16 = puVar16 + 1) {
              uVar12 = *puVar16;
              uVar8 = coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar12];
              if (uVar8 != 0) {
                uVar2 = nodePosition.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar12];
                uVar3 = degreePosition.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8];
                uVar23 = (ulong)uVar3;
                uVar4 = sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar23];
                uVar5 = sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar2];
                sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar2] = uVar4;
                sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar23] = uVar5;
                nodePosition.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[uVar12] = uVar3;
                nodePosition.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[uVar4] = uVar2;
                degreePosition.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar8] =
                     degreePosition.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar8] + 1;
                coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12] = uVar8 - 1;
                lVar20 = lVar20 + -1 + (ulong)(uVar23 < uVar13);
              }
            }
          }
        }
        lVar17 = local_120 + lVar20;
        auVar26._8_4_ = (int)((ulong)lVar17 >> 0x20);
        auVar26._0_8_ = lVar17;
        auVar26._12_4_ = 0x45300000;
        dVar27 = (auVar26._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0);
        local_100->__boundLast = dVar27;
        dVar25 = local_100->__boundMin;
        if (dVar27 < local_100->__boundMin) {
          local_100->__boundMin = dVar27;
          dVar25 = dVar27;
        }
      }
      local_118 = (size_type *)(double)local_100->__numV;
      sVar1 = local_100->__numRRsets;
      auVar30._8_4_ = (int)(sVar1 >> 0x20);
      auVar30._0_8_ = sVar1;
      auVar30._12_4_ = 0x45300000;
      dVar27 = (auVar30._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
      dVar28 = (double)local_118 / dVar27;
      local_100->__boundLast = dVar28 * local_100->__boundLast;
      local_100->__boundMin = dVar28 * dVar25;
      std::operator<<((ostream *)&std::cout,"  >>>[greedy-topk] influence: ");
      auVar31._0_8_ = (double)CONCAT44(0x43300000,(int)local_120);
      auVar31._8_4_ = (int)((ulong)local_120 >> 0x20);
      auVar31._12_4_ = 0x45300000;
      dStack_110 = auVar31._8_8_ - 1.9342813113834067e+25;
      local_118 = (size_type *)
                  (((dStack_110 + (auVar31._0_8_ - 4503599627370496.0)) * (double)local_118) /
                  dVar27);
      poVar18 = std::ostream::_M_insert<double>((double)local_118);
      std::operator<<(poVar18,", min-bound: ");
      poVar18 = std::ostream::_M_insert<double>(pAVar14->__boundMin);
      std::operator<<(poVar18,", last-bound: ");
      poVar18 = std::ostream::_M_insert<double>(pAVar14->__boundLast);
      std::operator<<(poVar18,'\n');
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&edgeMark.super__Bvector_base<std::allocator<bool>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&degreePosition.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&nodePosition.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&sortedNode.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&degMap);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return (double)local_118;
    }
    if (degreePosition.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar23] <= this->__numV - targetSize) {
      lVar20 = lVar20 + uVar23 * ((targetSize - this->__numV) +
                                 degreePosition.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar23 + 1]);
      goto LAB_00104bdc;
    }
    lVar20 = lVar20 + (degreePosition.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar23 + 1] -
                      degreePosition.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar23]) * uVar23;
    uVar23 = uVar23 - 1;
  } while( true );
}

Assistant:

double Alg::max_cover_topk(const int targetSize)
{
    FRset coverage(__numV, 0);
    size_t maxDeg = 0;
    for (auto i = __numV; i--;)
    {
        const auto deg = __hyperG._FRsets[i].size();
        coverage[i] = deg;
        if (deg > maxDeg) maxDeg = deg;
    }
    RRsets degMap(maxDeg + 1); // degMap: map degree to the nodes with this degree
    for (auto i = __numV; i--;)
    {
        //if (coverage[i] == 0) continue;
        degMap[coverage[i]].push_back(i);
    }
    Nodelist sortedNode(__numV); // sortedNode: record the sorted nodes in ascending order of degree
    Nodelist nodePosition(__numV); // nodePosition: record the position of each node in the sortedNode
    Nodelist degreePosition(maxDeg + 2); // degreePosition: the start position of each degree in sortedNode
    uint32_t idxSort = 0;
    size_t idxDegree = 0;
    for (auto& nodes : degMap)
    {
        degreePosition[idxDegree + 1] = degreePosition[idxDegree] + (uint32_t)nodes.size();
        idxDegree++;
        for (auto& node : nodes)
        {
            nodePosition[node] = idxSort;
            sortedNode[idxSort++] = node;
        }
    }
    // check if an edge is removed
    std::vector<bool> edgeMark(__numRRsets, false);
    // record the total of top-k marginal gains
    size_t sumTopk = 0;
    for (auto deg = maxDeg + 1; deg--;)
    {
        if (degreePosition[deg] <= __numV - targetSize)
        {
            sumTopk += deg * (degreePosition[deg + 1] - (__numV - targetSize));
            break;
        }
        sumTopk += deg * (degreePosition[deg + 1] - degreePosition[deg]);
    }
    __boundMin = 1.0 * sumTopk;
    __vecSeed.clear();
    size_t sumInf = 0;
    /*
    * sortedNode: position -> node
    * nodePosition: node -> position
    * degreePosition: degree -> position (start position of this degree)
    * coverage: node -> degree
    * e.g., swap the position of a node with the start position of its degree
    * swap(sortedNode[nodePosition[node]], sortedNode[degreePosition[coverage[node]]])
    */
    for (auto k = targetSize; k--;)
    {
        const auto seed = sortedNode.back();
        sortedNode.pop_back();
        const auto newNumV = sortedNode.size();
        sumTopk += coverage[sortedNode[newNumV - targetSize]] - coverage[seed];
        sumInf += coverage[seed];
        __vecSeed.push_back(seed);
        coverage[seed] = 0;
        for (auto edgeIdx : __hyperG._FRsets[seed])
        {
            if (edgeMark[edgeIdx]) continue;
            edgeMark[edgeIdx] = true;
            for (auto nodeIdx : __hyperG._RRsets[edgeIdx])
            {
                if (coverage[nodeIdx] == 0) continue; // This node is seed, skip
                const auto currPos = nodePosition[nodeIdx]; // The current position
                const auto currDeg = coverage[nodeIdx]; // The current degree
                const auto startPos = degreePosition[currDeg]; // The start position of this degree
                const auto startNode = sortedNode[startPos]; // The node with the start position
                // Swap this node to the start position with the same degree, and update their positions in nodePosition
                std::swap(sortedNode[currPos], sortedNode[startPos]);
                nodePosition[nodeIdx] = startPos;
                nodePosition[startNode] = currPos;
                // Increase the start position of this degree by 1, and decrease the degree of this node by 1
                degreePosition[currDeg]++;
                coverage[nodeIdx]--;
                // If the start position of this degree is in top-k, reduce topk by 1
                if (startPos >= newNumV - targetSize) sumTopk--;
            }
        }
        __boundLast = 1.0 * (sumInf + sumTopk);
        if (__boundMin > __boundLast) __boundMin = __boundLast;
    }
    __boundMin *= 1.0 * __numV / __numRRsets;
    __boundLast *= 1.0 * __numV / __numRRsets;
    const auto finalInf = 1.0 * sumInf * __numV / __numRRsets;
    std::cout << "  >>>[greedy-topk] influence: " << finalInf << ", min-bound: " << __boundMin <<
              ", last-bound: " << __boundLast << '\n';
    return finalInf;
}